

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

bool nullcInitPugiXMLModule(void)

{
  nullres nVar1;
  
  nVar1 = nullcBindModuleFunctionWrapper
                    ("ext.pugixml",NULLCPugiXML::description,
                     nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_parse_result*>,
                     "xml_parse_result::description",0);
  if ((((((((nVar1 != '\0') &&
           (nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_document__load,
                               nullcWrapCall3<NULLCPugiXML::xml_parse_result*,NULLCArray,unsigned_int,NULLCPugiXML::xml_document*>
                               ,"xml_document::load",0), nVar1 != '\0')) &&
          (nVar1 = nullcBindModuleFunctionWrapper
                             ("ext.pugixml",NULLCPugiXML::xml_document__load_file,
                              nullcWrapCall4<NULLCPugiXML::xml_parse_result*,NULLCArray,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                              ,"xml_document::load_file",0), nVar1 != '\0')) &&
         (((nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_document__load_buffer,
                               nullcWrapCall5<NULLCPugiXML::xml_parse_result*,NULLCArray,int,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                               ,"xml_document::load_buffer",0), nVar1 != '\0' &&
           (nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_document__load_buffer_inplace,
                               nullcWrapCall5<NULLCPugiXML::xml_parse_result*,NULLCArray,int,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                               ,"xml_document::load_buffer_inplace",0), nVar1 != '\0')) &&
          ((nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_document__save,
                               nullcWrapCall5<void,NULLCFuncPtr,NULLCArray,int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                               ,"xml_document::save",0), nVar1 != '\0' &&
           ((nVar1 = nullcBindModuleFunctionWrapper
                               ("ext.pugixml",NULLCPugiXML::xml_document__save_file,
                                nullcWrapCall5<int,NULLCArray,NULLCArray,int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                                ,"xml_document::save_file",0), nVar1 != '\0' &&
            (nVar1 = nullcBindModuleFunctionWrapper
                               ("ext.pugixml",NULLCPugiXML::xml_document__root,
                                nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_document*>,
                                "xml_document::root",0), nVar1 != '\0')))))))) &&
        (nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_document__finalize,
                            nullcWrapCall1<void,NULLCPugiXML::xml_document_impl*>,
                            "xml_document_impl::finalize",0), nVar1 != '\0')) &&
       (((nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__next_attribute,
                             nullcWrapCall1<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*>
                             ,"xml_attribute::next_attribute",0), nVar1 != '\0' &&
         (nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__previous_attribute,
                             nullcWrapCall1<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*>
                             ,"xml_attribute::previous_attribute",0), nVar1 != '\0')) &&
        (nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_int,
                            nullcWrapCall1<int,NULLCPugiXML::xml_attribute*>,"xml_attribute::as_int"
                            ,0), nVar1 != '\0')))) &&
      (((nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_double,
                            nullcWrapCall1<double,NULLCPugiXML::xml_attribute*>,
                            "xml_attribute::as_double",0), nVar1 != '\0' &&
        (nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_float,
                            nullcWrapCall1<float,NULLCPugiXML::xml_attribute*>,
                            "xml_attribute::as_float",0), nVar1 != '\0')) &&
       (((nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__as_bool,
                             nullcWrapCall1<int,NULLCPugiXML::xml_attribute*>,
                             "xml_attribute::as_bool",0), nVar1 != '\0' &&
         ((nVar1 = nullcBindModuleFunctionWrapper
                             ("ext.pugixml",NULLCPugiXML::xml_attribute__set_name,
                              nullcWrapCall2<int,NULLCArray,NULLCPugiXML::xml_attribute*>,
                              "xml_attribute::set_name",0), nVar1 != '\0' &&
          (nVar1 = nullcBindModuleFunctionWrapper
                             ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueS,
                              nullcWrapCall2<int,NULLCArray,NULLCPugiXML::xml_attribute*>,
                              "xml_attribute::set_value",0), nVar1 != '\0')))) &&
        (nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueI,
                            nullcWrapCall2<int,int,NULLCPugiXML::xml_attribute*>,
                            "xml_attribute::set_value",1), nVar1 != '\0')))))) &&
     (nVar1 = nullcBindModuleFunctionWrapper
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueD,
                         nullcWrapCall2<int,double,NULLCPugiXML::xml_attribute*>,
                         "xml_attribute::set_value",2), nVar1 != '\0')) {
    nVar1 = nullcBindModuleFunctionWrapper
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__empty,
                       nullcWrapCall1<int,NULLCPugiXML::xml_attribute*>,"xml_attribute::empty",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionWrapper
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__name,
                       nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_attribute*>,"xml_attribute::name"
                       ,0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionWrapper
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__value,
                       nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_attribute*>,
                       "xml_attribute::value",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionWrapper
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetS,
                       nullcWrapCall2<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCArray>
                       ,"=",1);
    if (((nVar1 != '\0') &&
        (nVar1 = nullcBindModuleFunctionWrapper
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetI,
                            nullcWrapCall2<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,int>
                            ,"=",2), nVar1 != '\0')) &&
       (nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetD,
                           nullcWrapCall2<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,double>
                           ,"=",3), nVar1 != '\0')) {
      nVar1 = nullcBindModuleFunctionWrapper
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorNot,
                         nullcWrapCall1<int,NULLCPugiXML::xml_attribute*>,"!",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorEqual,
                         nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                         ,"==",3);
      if ((nVar1 != '\0') &&
         (nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorNEqual,
                             nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                             ,"!=",3), nVar1 != '\0')) {
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorLess,
                           nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                           ,"<",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorGreater,
                           nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                           ,">",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorLEqual,
                           nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                           ,"<=",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorGEqual,
                           nullcWrapCall2<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                           ,">=",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__empty,
                           nullcWrapCall1<int,NULLCPugiXML::xml_node*>,"xml_node::empty",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__type,
                           nullcWrapCall1<pugi::xml_node_type,NULLCPugiXML::xml_node*>,
                           "xml_node::type",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__name,
                           nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_node*>,"xml_node::name",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__value,
                           nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_node*>,"xml_node::value",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__child,
                           nullcWrapCall2<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                           ,"xml_node::child",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__attribute,
                           nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                           ,"xml_node::attribute",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__next_sibling0,
                           nullcWrapCall2<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                           ,"xml_node::next_sibling",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("ext.pugixml",NULLCPugiXML::xml_node__next_sibling1,
                           nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>,
                           "xml_node::next_sibling",1);
        if (nVar1 != '\0') {
          nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_node__previous_sibling0,
                             nullcWrapCall2<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                             ,"xml_node::previous_sibling",0);
          if (nVar1 == '\0') {
            return false;
          }
          nVar1 = nullcBindModuleFunctionWrapper
                            ("ext.pugixml",NULLCPugiXML::xml_node__previous_sibling1,
                             nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>,
                             "xml_node::previous_sibling",1);
          if (nVar1 != '\0') {
            nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_node__parent,
                               nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>,
                               "xml_node::parent",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_node__root,
                               nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>,
                               "xml_node::root",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_node__child_value0,
                               nullcWrapCall1<NULLCArray,NULLCPugiXML::xml_node*>,
                               "xml_node::child_value",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("ext.pugixml",NULLCPugiXML::xml_node__child_value1,
                               nullcWrapCall2<NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>,
                               "xml_node::child_value",1);
            if (nVar1 != '\0') {
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__set_name,
                                 nullcWrapCall2<int,NULLCArray,NULLCPugiXML::xml_node*>,
                                 "xml_node::set_name",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__set_value,
                                 nullcWrapCall2<int,NULLCArray,NULLCPugiXML::xml_node*>,
                                 "xml_node::set_value",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_attribute,
                                 nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                                 ,"xml_node::append_attribute",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_attribute,
                                 nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                                 ,"xml_node::prepend_attribute",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_attribute_after,
                                 nullcWrapCall3<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_attribute_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_attribute_before,
                                 nullcWrapCall3<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_attribute_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_copy0,
                                 nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::append_copy",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_copy0,
                                 nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::prepend_copy",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_after0,
                                 nullcWrapCall3<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_copy_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_before0,
                                 nullcWrapCall3<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_copy_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_child,
                                 nullcWrapCall2<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*>
                                 ,"xml_node::append_child",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_child,
                                 nullcWrapCall2<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*>
                                 ,"xml_node::prepend_child",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_after,
                                 nullcWrapCall3<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_child_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_before,
                                 nullcWrapCall3<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                 ,"xml_node::insert_child_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_child1,
                                 nullcWrapCall2<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                                 ,"xml_node::append_child",1);
              if (((nVar1 != '\0') &&
                  (nVar1 = nullcBindModuleFunctionWrapper
                                     ("ext.pugixml",NULLCPugiXML::xml_node__prepend_child1,
                                      nullcWrapCall2<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                                      ,"xml_node::prepend_child",1), nVar1 != '\0')) &&
                 ((nVar1 = nullcBindModuleFunctionWrapper
                                     ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_after1,
                                      nullcWrapCall3<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                      ,"xml_node::insert_child_after",1), nVar1 != '\0' &&
                  ((((nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_before1,
                                         nullcWrapCall3<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                         ,"xml_node::insert_child_before",1), nVar1 != '\0' &&
                     (nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__append_copy1,
                                         nullcWrapCall2<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                         ,"xml_node::append_copy",1), nVar1 != '\0')) &&
                    (nVar1 = nullcBindModuleFunctionWrapper
                                       ("ext.pugixml",NULLCPugiXML::xml_node__prepend_copy1,
                                        nullcWrapCall2<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                        ,"xml_node::prepend_copy",1), nVar1 != '\0')) &&
                   ((nVar1 = nullcBindModuleFunctionWrapper
                                       ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_after1,
                                        nullcWrapCall3<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                        ,"xml_node::insert_copy_after",1), nVar1 != '\0' &&
                    (nVar1 = nullcBindModuleFunctionWrapper
                                       ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_before1,
                                        nullcWrapCall3<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                        ,"xml_node::insert_copy_before",1), nVar1 != '\0')))))))) {
                nVar1 = nullcBindModuleFunctionWrapper
                                  ("ext.pugixml",NULLCPugiXML::xml_node__remove_attribute0,
                                   nullcWrapCall2<void,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                   ,"xml_node::remove_attribute",0);
                if (nVar1 == '\0') {
                  return false;
                }
                nVar1 = nullcBindModuleFunctionWrapper
                                  ("ext.pugixml",NULLCPugiXML::xml_node__remove_attribute1,
                                   nullcWrapCall2<void,NULLCArray,NULLCPugiXML::xml_node*>,
                                   "xml_node::remove_attribute",1);
                if (nVar1 != '\0') {
                  nVar1 = nullcBindModuleFunctionWrapper
                                    ("ext.pugixml",NULLCPugiXML::xml_node__remove_child0,
                                     nullcWrapCall2<void,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                     ,"xml_node::remove_child",0);
                  if (nVar1 == '\0') {
                    return false;
                  }
                  nVar1 = nullcBindModuleFunctionWrapper
                                    ("ext.pugixml",NULLCPugiXML::xml_node__remove_child1,
                                     nullcWrapCall2<void,NULLCArray,NULLCPugiXML::xml_node*>,
                                     "xml_node::remove_child",1);
                  if (nVar1 != '\0') {
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",NULLCPugiXML::xml_node__first_attribute,
                                       nullcWrapCall1<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_node*>
                                       ,"xml_node::first_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",NULLCPugiXML::xml_node__last_attribute,
                                       nullcWrapCall1<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_node*>
                                       ,"xml_node::last_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",NULLCPugiXML::xml_node__first_child,
                                       nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                                       ,"xml_node::first_child",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",NULLCPugiXML::xml_node__last_child,
                                       nullcWrapCall1<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                                       ,"xml_node::last_child",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",
                                       NULLCPugiXML::xml_node__find_child_by_attribute0,
                                       nullcWrapCall4<NULLCPugiXML::xml_node,NULLCArray,NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>
                                       ,"xml_node::find_child_by_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionWrapper
                                      ("ext.pugixml",
                                       NULLCPugiXML::xml_node__find_child_by_attribute1,
                                       nullcWrapCall3<NULLCPugiXML::xml_node,NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>
                                       ,"xml_node::find_child_by_attribute",1);
                    if (nVar1 != '\0') {
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__first_element_by_path
                                         ,
                                         nullcWrapCall3<NULLCPugiXML::xml_node,NULLCArray,char,NULLCPugiXML::xml_node*>
                                         ,"xml_node::first_element_by_path",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__offset_debug,
                                         nullcWrapCall1<int,NULLCPugiXML::xml_node*>,
                                         "xml_node::offset_debug",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__traverse,
                                         nullcWrapCall4<int,NULLCFuncPtr,NULLCFuncPtr,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                         ,"xml_node::traverse",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__print,
                                         nullcWrapCall6<void,NULLCFuncPtr,NULLCArray,int,pugi::xml_encoding,int,NULLCPugiXML::xml_node*>
                                         ,"xml_node::print",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_attribute,
                                         nullcWrapCall2<NULLCPugiXML::xml_attribute,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                         ,"xml_node::find_attribute",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_child,
                                         nullcWrapCall2<NULLCPugiXML::xml_node,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                         ,"xml_node::find_child",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_node,
                                         nullcWrapCall2<NULLCPugiXML::xml_node,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                         ,"xml_node::find_node",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionWrapper
                                        ("ext.pugixml",NULLCPugiXML::xml_node__operatorNot,
                                         nullcWrapCall1<int,NULLCPugiXML::xml_node*>,"!",1);
                      if (((nVar1 != '\0') &&
                          (nVar1 = nullcBindModuleFunctionWrapper
                                             ("ext.pugixml",NULLCPugiXML::xml_node__operatorEqual,
                                              nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                              ,"==",4), nVar1 != '\0')) &&
                         ((nVar1 = nullcBindModuleFunctionWrapper
                                             ("ext.pugixml",NULLCPugiXML::xml_node__operatorNEqual,
                                              nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                              ,"!=",4), nVar1 != '\0' &&
                          (((nVar1 = nullcBindModuleFunctionWrapper
                                               ("ext.pugixml",NULLCPugiXML::xml_node__operatorLess,
                                                nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                                ,"<",1), nVar1 != '\0' &&
                            (nVar1 = nullcBindModuleFunctionWrapper
                                               ("ext.pugixml",
                                                NULLCPugiXML::xml_node__operatorGreater,
                                                nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                                ,">",1), nVar1 != '\0')) &&
                           (nVar1 = nullcBindModuleFunctionWrapper
                                              ("ext.pugixml",NULLCPugiXML::xml_node__operatorLEqual,
                                               nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                               ,"<=",1), nVar1 != '\0')))))) {
                        nVar1 = nullcBindModuleFunctionWrapper
                                          ("ext.pugixml",NULLCPugiXML::xml_node__operatorGEqual,
                                           nullcWrapCall2<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                           ,">=",1);
                        return nVar1 != '\0';
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

xml_parse_result* xml_document__load(NULLCArray contents, unsigned int options, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_string(contents.ptr, options);
		return res;
	}